

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O3

void __thiscall QWidgetPrivate::setSharedPainter(QWidgetPrivate *this,QPainter *painter)

{
  long *plVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  
  lVar2 = *(long *)&this->field_0x8;
  do {
    this_00 = *(QWidgetPrivate **)(lVar2 + 8);
    if (*(long *)&this_00->field_0x10 == 0) break;
    plVar1 = (long *)(lVar2 + 0x20);
    lVar2 = *(long *)&this_00->field_0x10;
  } while ((*(uint *)(*plVar1 + 0xc) & 1) == 0);
  createTLExtra(this_00);
  *(QPainter **)
   ((long)(((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
            .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
          super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) = painter;
  return;
}

Assistant:

inline void QWidgetPrivate::setSharedPainter(QPainter *painter)
{
    Q_Q(QWidget);
    QTLWExtra *x = q->window()->d_func()->topData();
    x->sharedPainter = painter;
}